

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O1

void __thiscall
QRegularExpressionPrivate::doMatch
          (QRegularExpressionPrivate *this,QRegularExpressionMatchPrivate *priv,qsizetype offset,
          CheckSubjectStringOption checkSubjectStringOption,QRegularExpressionMatchPrivate *previous
          )

{
  MatchType MVar1;
  long *plVar2;
  uint uVar3;
  uint uVar4;
  pcre2_match_context_16 *matchContext;
  pcre2_match_data_16 *matchData;
  pointer plVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  storage_type_conflict *subject;
  long lVar9;
  pcre2_code_16 *code;
  long in_FS_OFFSET;
  bool bVar10;
  uint maximumLookBehind;
  char16_t dummySubject;
  uint local_40;
  storage_type_conflict local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = (priv->subject).m_size;
  lVar9 = (offset >> 0x3f & uVar6) + offset;
  if (((long)uVar6 < lVar9 || lVar9 < 0) || (this->compiledPattern == (pcre2_code_16 *)0x0))
  goto LAB_0011d19f;
  MVar1 = priv->matchType;
  if (MVar1 == NoMatch) {
    priv->isValid = true;
    goto LAB_0011d19f;
  }
  uVar4 = (uint)(byte)(priv->matchOptions).
                      super_QFlagsStorageHelper<QRegularExpression::MatchOption,_4>.
                      super_QFlagsStorage<QRegularExpression::MatchOption>.i;
  uVar4 = (uVar4 & 2) << 0x1d | uVar4 << 0x1f;
  if (MVar1 == PartialPreferFirstMatch) {
    uVar4 = uVar4 | 0x20;
  }
  else if (MVar1 == PartialPreferCompleteMatch) {
    uVar4 = uVar4 | 0x10;
  }
  uVar3 = uVar4 | 0x40000000;
  if (checkSubjectStringOption != DontCheckSubjectString) {
    uVar3 = uVar4;
  }
  if ((previous == (QRegularExpressionMatchPrivate *)0x0) || (previous->hasMatch != true)) {
    bVar10 = false;
  }
  else {
    plVar2 = (previous->capturedOffsets).d.ptr;
    bVar10 = *plVar2 == plVar2[1];
  }
  matchContext = (pcre2_match_context_16 *)pcre2_match_context_create_16(0);
  pcre2_jit_stack_assign_16(matchContext,qtPcreCallback,0);
  matchData = (pcre2_match_data_16 *)
              pcre2_match_data_create_from_pattern_16(this->compiledPattern,0);
  local_3a = L'\0';
  subject = (priv->subject).m_data;
  if (subject == (storage_type_conflict *)0x0) {
    subject = &local_3a;
  }
  code = this->compiledPattern;
  if (bVar10) {
    uVar4 = safe_pcre2_match_16(code,(PCRE2_SPTR16)subject,uVar6,lVar9,uVar3 | 0x80000008,matchData,
                                matchContext);
    if (uVar4 == 0xffffffff) {
      lVar7 = lVar9 + 1;
      if ((((this->usingCrLfNewlines == true) && (lVar7 < (long)uVar6)) && (subject[lVar9] == L'\r')
          ) && (subject[lVar9 + 1] == L'\n')) {
        lVar7 = lVar9 + 2;
      }
      else if ((lVar7 < (long)uVar6) && ((subject[lVar9 + 1] & 0xfc00U) == 0xdc00)) {
        lVar7 = lVar9 + 2;
      }
      code = this->compiledPattern;
      lVar9 = lVar7;
      goto LAB_0011d0c2;
    }
  }
  else {
LAB_0011d0c2:
    uVar4 = safe_pcre2_match_16(code,(PCRE2_SPTR16)subject,uVar6,lVar9,uVar3,matchData,matchContext)
    ;
  }
  if ((int)uVar4 < 1) {
    priv->hasPartialMatch = uVar4 == 0xfffffffe;
    priv->isValid = 0xfffffffd < uVar4;
    if (uVar4 == 0xfffffffe) {
      priv->capturedCount = 1;
      uVar6 = 2;
      goto LAB_0011d10c;
    }
    priv->capturedCount = 0;
    QList<long_long>::clear(&priv->capturedOffsets);
  }
  else {
    priv->isValid = true;
    priv->hasMatch = true;
    priv->capturedCount = uVar4;
    uVar6 = (ulong)(uVar4 * 2);
LAB_0011d10c:
    QList<long_long>::resize(&priv->capturedOffsets,uVar6);
  }
  if (priv->capturedCount != 0) {
    lVar9 = pcre2_get_ovector_pointer_16(matchData);
    plVar5 = QList<long_long>::data(&priv->capturedOffsets);
    if (0 < priv->capturedCount) {
      uVar3 = priv->capturedCount * 2;
      uVar6 = 1;
      if (1 < (int)uVar3) {
        uVar6 = (ulong)uVar3;
      }
      uVar8 = 0;
      do {
        plVar5[uVar8] = *(longlong *)(lVar9 + uVar8 * 8);
        uVar8 = uVar8 + 1;
      } while (uVar6 != uVar8);
    }
    if (uVar4 == 0xfffffffe) {
      local_40 = 0xaaaaaaaa;
      pcre2_pattern_info_16(this->compiledPattern,0xf,&local_40);
      *plVar5 = *plVar5 - (ulong)local_40;
    }
  }
  pcre2_match_data_free_16(matchData);
  pcre2_match_context_free_16(matchContext);
LAB_0011d19f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRegularExpressionPrivate::doMatch(QRegularExpressionMatchPrivate *priv,
                                        qsizetype offset,
                                        CheckSubjectStringOption checkSubjectStringOption,
                                        const QRegularExpressionMatchPrivate *previous) const
{
    Q_ASSERT(priv);
    Q_ASSERT(priv != previous);

    const qsizetype subjectLength = priv->subject.size();

    if (offset < 0)
        offset += subjectLength;

    if (offset < 0 || offset > subjectLength)
        return;

    if (Q_UNLIKELY(!compiledPattern)) {
        qtWarnAboutInvalidRegularExpression(pattern, "QRegularExpressionPrivate::doMatch");
        return;
    }

    // skip doing the actual matching if NoMatch type was requested
    if (priv->matchType == QRegularExpression::NoMatch) {
        priv->isValid = true;
        return;
    }

    int pcreOptions = convertToPcreOptions(priv->matchOptions);

    if (priv->matchType == QRegularExpression::PartialPreferCompleteMatch)
        pcreOptions |= PCRE2_PARTIAL_SOFT;
    else if (priv->matchType == QRegularExpression::PartialPreferFirstMatch)
        pcreOptions |= PCRE2_PARTIAL_HARD;

    if (checkSubjectStringOption == DontCheckSubjectString)
        pcreOptions |= PCRE2_NO_UTF_CHECK;

    bool previousMatchWasEmpty = false;
    if (previous && previous->hasMatch &&
            (previous->capturedOffsets.at(0) == previous->capturedOffsets.at(1))) {
        previousMatchWasEmpty = true;
    }

    pcre2_match_context_16 *matchContext = pcre2_match_context_create_16(nullptr);
    pcre2_jit_stack_assign_16(matchContext, &qtPcreCallback, nullptr);
    pcre2_match_data_16 *matchData = pcre2_match_data_create_from_pattern_16(compiledPattern, nullptr);

    // PCRE does not accept a null pointer as subject string, even if
    // its length is zero. We however allow it in input: a QStringView
    // subject may have data == nullptr. In this case, to keep PCRE
    // happy, pass a pointer to a dummy character.
    const char16_t dummySubject = 0;
    const char16_t * const subjectUtf16 = [&]()
    {
        const auto subjectUtf16 = priv->subject.utf16();
        if (subjectUtf16)
            return subjectUtf16;
        Q_ASSERT(subjectLength == 0);
        return &dummySubject;
    }();

    int result;

    if (!previousMatchWasEmpty) {
        result = safe_pcre2_match_16(compiledPattern,
                                     reinterpret_cast<PCRE2_SPTR16>(subjectUtf16), subjectLength,
                                     offset, pcreOptions,
                                     matchData, matchContext);
    } else {
        result = safe_pcre2_match_16(compiledPattern,
                                     reinterpret_cast<PCRE2_SPTR16>(subjectUtf16), subjectLength,
                                     offset, pcreOptions | PCRE2_NOTEMPTY_ATSTART | PCRE2_ANCHORED,
                                     matchData, matchContext);

        if (result == PCRE2_ERROR_NOMATCH) {
            ++offset;

            if (usingCrLfNewlines
                    && offset < subjectLength
                    && subjectUtf16[offset - 1] == u'\r'
                    && subjectUtf16[offset] == u'\n') {
                ++offset;
            } else if (offset < subjectLength
                       && QChar::isLowSurrogate(subjectUtf16[offset])) {
                ++offset;
            }

            result = safe_pcre2_match_16(compiledPattern,
                                         reinterpret_cast<PCRE2_SPTR16>(subjectUtf16), subjectLength,
                                         offset, pcreOptions,
                                         matchData, matchContext);
        }
    }

#ifdef QREGULAREXPRESSION_DEBUG
    qDebug() << "Matching" <<  pattern << "against" << subject
             << "offset" << offset
             << priv->matchType << priv->matchOptions << previousMatchWasEmpty
             << "result" << result;
#endif

    // result == 0 means not enough space in captureOffsets; should never happen
    Q_ASSERT(result != 0);

    if (result > 0) {
        // full match
        priv->isValid = true;
        priv->hasMatch = true;
        priv->capturedCount = result;
        priv->capturedOffsets.resize(result * 2);
    } else {
        // no match, partial match or error
        priv->hasPartialMatch = (result == PCRE2_ERROR_PARTIAL);
        priv->isValid = (result == PCRE2_ERROR_NOMATCH || result == PCRE2_ERROR_PARTIAL);

        if (result == PCRE2_ERROR_PARTIAL) {
            // partial match:
            // leave the start and end capture offsets (i.e. cap(0))
            priv->capturedCount = 1;
            priv->capturedOffsets.resize(2);
        } else {
            // no match or error
            priv->capturedCount = 0;
            priv->capturedOffsets.clear();
        }
    }

    // copy the captured substrings offsets, if any
    if (priv->capturedCount) {
        PCRE2_SIZE *ovector = pcre2_get_ovector_pointer_16(matchData);
        qsizetype *const capturedOffsets = priv->capturedOffsets.data();

        // We rely on the fact that capturing groups that did not
        // capture anything have offset -1, but PCRE technically
        // returns "PCRE2_UNSET". Test that out, better safe than
        // sorry...
        static_assert(qsizetype(PCRE2_UNSET) == qsizetype(-1), "Internal error: PCRE2 changed its API");

        for (int i = 0; i < priv->capturedCount * 2; ++i)
            capturedOffsets[i] = qsizetype(ovector[i]);

        // For partial matches, PCRE2 and PCRE1 differ in behavior when lookbehinds
        // are involved. PCRE2 reports the real begin of the match and the maximum
        // used lookbehind as distinct information; PCRE1 instead automatically
        // adjusted ovector[0] to include the maximum lookbehind.
        //
        // For instance, given the pattern "\bstring\b", and the subject "a str":
        // * PCRE1 reports partial, capturing " str"
        // * PCRE2 reports partial, capturing "str" with a lookbehind of 1
        //
        // To keep behavior, emulate PCRE1 here.
        // (Eventually, we could expose the lookbehind info in a future patch.)
        if (result == PCRE2_ERROR_PARTIAL) {
            unsigned int maximumLookBehind;
            pcre2_pattern_info_16(compiledPattern, PCRE2_INFO_MAXLOOKBEHIND, &maximumLookBehind);
            capturedOffsets[0] -= maximumLookBehind;
        }
    }

    pcre2_match_data_free_16(matchData);
    pcre2_match_context_free_16(matchContext);
}